

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O2

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*>
               (move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                first,move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      last,
               move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               buffer_begin,long *param_4,low_byte_fn *param_5,long param_6)

{
  long lVar1;
  size_t __n;
  long *plVar2;
  long lVar3;
  anon_class_16_2_d94e93d1 map;
  anon_class_16_2_d94e93d1 map_00;
  
  __n = (long)last._M_current._M_current - (long)first._M_current._M_current;
  lVar3 = (long)__n >> 2;
  lVar1 = *(long *)(param_5 + param_6 * 8 + 8);
  if (lVar1 != lVar3 || *(long *)(param_5 + param_6 * 8) != lVar3) {
    plVar2 = param_4;
    if (*(long *)(param_5 + param_6 * 8) == lVar3) {
      if (last._M_current._M_current != first._M_current._M_current) {
        memmove((void *)buffer_begin._M_current._M_current,(void *)first._M_current._M_current,__n);
      }
    }
    else {
      map.map = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
                (param_4 + param_6 * 0x100);
      map.radix = param_5;
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>>,long*>
                (first,last,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 buffer_begin._M_current._M_current,map,param_4);
    }
    if (lVar1 == lVar3) {
      if (last._M_current._M_current != first._M_current._M_current) {
        memmove((void *)first._M_current._M_current,(void *)buffer_begin._M_current._M_current,__n);
        return;
      }
    }
    else {
      map_00.map = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
                   (param_4 + (param_6 + 1) * 0x100);
      map_00.radix = param_5;
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>>,long*>
                (buffer_begin,
                 (move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  )(__n + (long)buffer_begin._M_current._M_current),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 first._M_current._M_current,map_00,plVar2);
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }